

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::TypedExpectation<bool_(const_pstore::brokerface::message_type_&)>::
TypedExpectation(TypedExpectation<bool_(const_pstore::brokerface::message_type_&)> *this,
                FunctionMocker<bool_(const_pstore::brokerface::message_type_&)> *owner,char *a_file,
                int a_line,string *a_source_text,ArgumentMatcherTuple *m)

{
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_001648f0;
  this->owner_ = owner;
  Matcher<const_pstore::brokerface::message_type_&>::Matcher
            ((Matcher<const_pstore::brokerface::message_type_&> *)&this->matchers_,
             (Matcher<const_pstore::brokerface::message_type_&> *)m);
  (this->extra_matcher_).
  super_MatcherBase<const_std::tuple<const_pstore::brokerface::message_type_&>_&>.vtable_ =
       (VTable *)
       MatcherBase<std::tuple<pstore::brokerface::message_type_const&>const&>::
       GetVTable<testing::internal::MatcherBase<std::tuple<pstore::brokerface::message_type_const&>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  (this->extra_matcher_).
  super_MatcherBase<const_std::tuple<const_pstore::brokerface::message_type_&>_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00164938;
  *(undefined8 *)&(this->repeated_action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->repeated_action_).fun_.super__Function_base._M_functor + 8) = 0;
  (this->repeated_action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->repeated_action_).fun_._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

TypedExpectation(FunctionMocker<F>* owner, const char* a_file, int a_line,
                   const std::string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}